

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_scan_clienthello_tlsext
               (SSL_HANDSHAKE *hs,SSL_CLIENT_HELLO *client_hello,int *out_alert)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  byte local_89;
  undefined1 local_88 [7];
  uint8_t alert_1;
  CBS fake_contents;
  CBS *contents;
  size_t i;
  tls_extension *ptStack_60;
  uint8_t alert;
  tls_extension *ext;
  undefined1 local_50 [4];
  uint ext_index;
  CBS extension;
  undefined1 local_38 [6];
  uint16_t type;
  CBS extensions;
  int *out_alert_local;
  SSL_CLIENT_HELLO *client_hello_local;
  SSL_HANDSHAKE *hs_local;
  
  (hs->extensions).sent = 0;
  extensions.len = (size_t)out_alert;
  CBS_init((CBS *)local_38,client_hello->extensions,client_hello->extensions_len);
  while (sVar3 = CBS_len((CBS *)local_38), sVar3 != 0) {
    iVar2 = CBS_get_u16((CBS *)local_38,(uint16_t *)((long)&extension.len + 6));
    if ((iVar2 == 0) ||
       (iVar2 = CBS_get_u16_length_prefixed((CBS *)local_38,(CBS *)local_50), iVar2 == 0)) {
      *(undefined4 *)extensions.len = 0x32;
      return false;
    }
    ptStack_60 = tls_extension_find((uint32_t *)((long)&ext + 4),extension.len._6_2_);
    if (ptStack_60 != (tls_extension *)0x0) {
      (hs->extensions).sent = 1 << ((byte)ext._4_4_ & 0x1f) | (hs->extensions).sent;
      i._7_1_ = 0x32;
      bVar1 = (*ptStack_60->parse_clienthello)(hs,(uint8_t *)((long)&i + 7),(CBS *)local_50);
      if (!bVar1) {
        *(uint *)extensions.len = (uint)i._7_1_;
        ERR_put_error(0x10,0,0x95,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xfd2);
        ERR_add_error_dataf("extension %u",(ulong)extension.len._6_2_);
        return false;
      }
    }
  }
  contents = (CBS *)0x0;
  do {
    if ((CBS *)0x1b < contents) {
      return true;
    }
    if (((hs->extensions).sent & 1 << ((byte)contents & 0x1f)) == 0) {
      fake_contents.len = 0;
      if ((*(short *)(kExtensions + (long)contents * 0x28) == -0xff) &&
         (bVar1 = ssl_client_cipher_list_contains_cipher(client_hello,0xff), bVar1)) {
        CBS_init((CBS *)local_88,"",1);
        fake_contents.len = (size_t)local_88;
        (hs->extensions).sent = 1 << ((byte)contents & 0x1f) | (hs->extensions).sent;
      }
      local_89 = 0x32;
      uVar4 = (**(code **)(kExtensions + (long)contents * 0x28 + 0x18))
                        (hs,&local_89,fake_contents.len);
      if ((uVar4 & 1) == 0) {
        ERR_put_error(0x10,0,0xa4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xfee);
        ERR_add_error_dataf("extension %u",(ulong)*(ushort *)(kExtensions + (long)contents * 0x28));
        *(uint *)extensions.len = (uint)local_89;
        return false;
      }
    }
    contents = (CBS *)((long)&contents->data + 1);
  } while( true );
}

Assistant:

static bool ssl_scan_clienthello_tlsext(SSL_HANDSHAKE *hs,
                                        const SSL_CLIENT_HELLO *client_hello,
                                        int *out_alert) {
  hs->extensions.received = 0;
  CBS extensions;
  CBS_init(&extensions, client_hello->extensions, client_hello->extensions_len);
  while (CBS_len(&extensions) != 0) {
    uint16_t type;
    CBS extension;

    // Decode the next extension.
    if (!CBS_get_u16(&extensions, &type) ||
        !CBS_get_u16_length_prefixed(&extensions, &extension)) {
      *out_alert = SSL_AD_DECODE_ERROR;
      return false;
    }

    unsigned ext_index;
    const struct tls_extension *const ext =
        tls_extension_find(&ext_index, type);
    if (ext == NULL) {
      continue;
    }

    hs->extensions.received |= (1u << ext_index);
    uint8_t alert = SSL_AD_DECODE_ERROR;
    if (!ext->parse_clienthello(hs, &alert, &extension)) {
      *out_alert = alert;
      OPENSSL_PUT_ERROR(SSL, SSL_R_ERROR_PARSING_EXTENSION);
      ERR_add_error_dataf("extension %u", (unsigned)type);
      return false;
    }
  }

  for (size_t i = 0; i < kNumExtensions; i++) {
    if (hs->extensions.received & (1u << i)) {
      continue;
    }

    CBS *contents = NULL, fake_contents;
    static const uint8_t kFakeRenegotiateExtension[] = {0};
    if (kExtensions[i].value == TLSEXT_TYPE_renegotiate &&
        ssl_client_cipher_list_contains_cipher(client_hello,
                                               SSL3_CK_SCSV & 0xffff)) {
      // The renegotiation SCSV was received so pretend that we received a
      // renegotiation extension.
      CBS_init(&fake_contents, kFakeRenegotiateExtension,
               sizeof(kFakeRenegotiateExtension));
      contents = &fake_contents;
      hs->extensions.received |= (1u << i);
    }

    // Extension wasn't observed so call the callback with a NULL
    // parameter.
    uint8_t alert = SSL_AD_DECODE_ERROR;
    if (!kExtensions[i].parse_clienthello(hs, &alert, contents)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_MISSING_EXTENSION);
      ERR_add_error_dataf("extension %u", (unsigned)kExtensions[i].value);
      *out_alert = alert;
      return false;
    }
  }

  return true;
}